

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O2

Ref<embree::Image> __thiscall embree::loadTGA(embree *this,FileName *fileName)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  ImageT<embree::Col4<float>_> *this_00;
  runtime_error *prVar9;
  size_t y;
  ulong uVar10;
  size_t x;
  ulong uVar11;
  undefined1 auVar12 [16];
  string local_268;
  fstream file;
  
  std::fstream::fstream(&file);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::fstream::open((char *)&file,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  uVar1 = fread_uchar(&file);
  if (uVar1 != '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = fread_uchar(&file);
  if (uVar1 != '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = fread_uchar(&file);
  if (uVar1 != '\x02') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = fread_ushort(&file);
  uVar6 = fread_ushort(&file);
  uVar1 = fread_uchar(&file);
  uVar7 = fread_ushort(&file);
  uVar8 = fread_ushort(&file);
  if ((uVar1 == '\0') && ((uVar8 == 0 && uVar7 == 0) && (uVar6 == 0 && uVar5 == 0))) {
    uVar5 = fread_ushort(&file);
    uVar6 = fread_ushort(&file);
    uVar1 = fread_uchar(&file);
    if (uVar1 != '\x18') {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"unsupported TGA file bits per pixel");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = fread_uchar(&file);
    if (uVar1 == ' ') {
      this_00 = (ImageT<embree::Col4<float>_> *)::operator_new(0x48);
      std::__cxx11::string::string((string *)&local_268,(string *)fileName);
      ImageT<embree::Col4<float>_>::ImageT(this_00,(ulong)uVar5,(ulong)uVar6,&local_268);
      *(ImageT<embree::Col4<float>_> **)this = this_00;
      (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
      std::__cxx11::string::~string((string *)&local_268);
      for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
        for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
          bVar2 = fread_uchar(&file);
          bVar3 = fread_uchar(&file);
          bVar4 = fread_uchar(&file);
          local_268._M_dataplus._M_p._0_4_ = (float)bVar4 / 255.0;
          auVar12._0_4_ = (float)bVar3;
          auVar12._4_4_ = (float)bVar2;
          auVar12._8_8_ = 0;
          auVar12 = divps(auVar12,_DAT_0021f8a0);
          local_268._M_dataplus._M_p._4_4_ = auVar12._0_4_;
          local_268._M_string_length._0_4_ = auVar12._4_4_;
          local_268._M_string_length._4_4_ = 0x3f800000;
          (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])
                    (this_00,uVar11,uVar10,&local_268);
        }
      }
      std::fstream::~fstream(&file);
      return (Ref<embree::Image>)(Image *)this;
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadTGA(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    unsigned char idlength = fread_uchar(file);
    if (idlength != 0) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned char colormaptype = fread_uchar(file);
    if (colormaptype != 0) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned char datatype = fread_uchar(file);
    if (datatype != 2) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned short cmo = fread_ushort(file);
    unsigned short cml = fread_ushort(file);
    unsigned char  cmd = fread_uchar(file);
    unsigned short xorg = fread_ushort(file);
    unsigned short yorg = fread_ushort(file);
    if (cmo != 0 || cml != 0 || cmd != 0 || xorg != 0 || yorg != 0)
      THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned short width = fread_ushort(file);
    unsigned short height = fread_ushort(file);
    
    unsigned char bits = fread_uchar(file);
    if (bits != 3*8) THROW_RUNTIME_ERROR("unsupported TGA file bits per pixel");
    
    unsigned char desc = fread_uchar(file);
    if (desc != 0x20) THROW_RUNTIME_ERROR("unsupported TGA file");

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    /* load image data */
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        const unsigned char b = fread_uchar(file);
        const unsigned char g = fread_uchar(file);
        const unsigned char r = fread_uchar(file);
        img->set(x,y,Color4(r/255.0f,g/255.0f,b/255.0f,1.0f));
      }
    }

    return img;
  }